

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str,StringRef *matcherString)

{
  Choice in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  StringRef *in_stack_ffffffffffffffb0;
  StringMatcher *in_stack_ffffffffffffffb8;
  AssertionHandler *in_stack_ffffffffffffffc0;
  
  Matchers::Equals(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  handleExceptionMatchExpr
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Matchers::StdString::EqualsMatcher::~EqualsMatcher((EqualsMatcher *)0x23b2b8);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str, StringRef const& matcherString  ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ), matcherString );
    }